

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  uchar *key_data;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  FILE *__stream;
  Pl_StdioFile *this_00;
  Pl_RC4 *pPVar6;
  void *__buf;
  FILE *__n;
  size_t len;
  undefined1 local_f8 [7];
  bool done;
  uchar buf [100];
  Pl_RC4 *rc4;
  Pl_StdioFile *out;
  FILE *outfile;
  long val;
  char t [3];
  FILE *pFStack_58;
  uint i;
  FILE *infile;
  uchar *key;
  size_t sStack_40;
  uint keylen;
  uint local_34;
  char *pcStack_30;
  uint hexkeylen;
  char *outfilename;
  char *infilename;
  char *hexkey;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  hexkey = (char *)argv;
  argv_local._0_4_ = argc;
  if ((argc == 2) && (iVar2 = strcmp(argv[1],"other"), iVar2 == 0)) {
    other_tests();
  }
  else {
    if ((int)argv_local != 4) {
      this = std::operator<<((ostream *)&std::cerr,"Usage: rc4 hex-key infile outfile");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(2);
    }
    infilename = *(char **)(hexkey + 8);
    outfilename = *(char **)(hexkey + 0x10);
    pcStack_30 = *(char **)(hexkey + 0x18);
    sStack_40 = strlen(infilename);
    local_34 = QIntC::to_uint<unsigned_long>(&stack0xffffffffffffffc0);
    key._4_4_ = local_34 >> 1;
    key_data = (uchar *)operator_new__((ulong)(key._4_4_ + 1));
    key_data[key._4_4_] = '\0';
    pFStack_58 = (FILE *)QUtil::safe_fopen(outfilename,"rb");
    for (val._4_4_ = 0; uVar3 = (ulong)val._4_4_, sVar4 = strlen(infilename), uVar3 < sVar4;
        val._4_4_ = val._4_4_ + 2) {
      val._1_1_ = infilename[val._4_4_];
      val._2_1_ = infilename[val._4_4_ + 1];
      val._3_1_ = 0;
      lVar5 = strtol((char *)((long)&val + 1),(char **)0x0,0x10);
      key_data[val._4_4_ >> 1] = (uchar)lVar5;
    }
    __stream = (FILE *)QUtil::safe_fopen(pcStack_30,"wb");
    this_00 = (Pl_StdioFile *)operator_new(0x38);
    Pl_StdioFile::Pl_StdioFile(this_00,"stdout",(FILE *)__stream);
    pPVar6 = (Pl_RC4 *)operator_new(0x58);
    iVar2 = QIntC::to_int<unsigned_int>((uint *)((long)&key + 4));
    Pl_RC4::Pl_RC4(pPVar6,"rc4",(Pipeline *)this_00,key_data,iVar2,0x40);
    unique0x100002d4 = pPVar6;
    if (key_data != (uchar *)0x0) {
      operator_delete__(key_data);
    }
    bVar1 = false;
    while (!bVar1) {
      __n = pFStack_58;
      __buf = (void *)fread(local_f8,1,100,pFStack_58);
      if (__buf == (void *)0x0) {
        bVar1 = true;
      }
      else {
        Pl_RC4::write(stack0xffffffffffffff70,(int)local_f8,__buf,(size_t)__n);
      }
    }
    Pl_RC4::finish(stack0xffffffffffffff70);
    pPVar6 = stack0xffffffffffffff70;
    if (stack0xffffffffffffff70 != (Pl_RC4 *)0x0) {
      Pl_RC4::~Pl_RC4(stack0xffffffffffffff70);
      operator_delete(pPVar6,0x58);
    }
    if (this_00 != (Pl_StdioFile *)0x0) {
      (*(this_00->super_Pipeline)._vptr_Pipeline[1])();
    }
    fclose(pFStack_58);
    fclose(__stream);
  }
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((argc == 2) && (strcmp(argv[1], "other") == 0)) {
        other_tests();
        return 0;
    }

    if (argc != 4) {
        std::cerr << "Usage: rc4 hex-key infile outfile" << std::endl;
        exit(2);
    }

    char* hexkey = argv[1];
    char* infilename = argv[2];
    char* outfilename = argv[3];
    unsigned int hexkeylen = QIntC::to_uint(strlen(hexkey));
    unsigned int keylen = hexkeylen / 2;
    auto* key = new unsigned char[keylen + 1];
    key[keylen] = '\0';

    FILE* infile = QUtil::safe_fopen(infilename, "rb");
    for (unsigned int i = 0; i < strlen(hexkey); i += 2) {
        char t[3];
        t[0] = hexkey[i];
        t[1] = hexkey[i + 1];
        t[2] = '\0';

        long val = strtol(t, nullptr, 16);
        key[i / 2] = static_cast<unsigned char>(val);
    }

    FILE* outfile = QUtil::safe_fopen(outfilename, "wb");
    auto* out = new Pl_StdioFile("stdout", outfile);
    // Use a small buffer size (64) for testing
    auto* rc4 = new Pl_RC4("rc4", out, key, QIntC::to_int(keylen), 64U);
    delete[] key;

    // 64 < buffer size < 512, buffer_size is not a power of 2 for testing
    unsigned char buf[100];
    bool done = false;
    while (!done) {
        size_t len = fread(buf, 1, sizeof(buf), infile);
        if (len <= 0) {
            done = true;
        } else {
            rc4->write(buf, len);
        }
    }
    rc4->finish();
    delete rc4;
    delete out;
    fclose(infile);
    fclose(outfile);
    return 0;
}